

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmik.cpp
# Opt level: O2

void __thiscall lmik::solve(lmik *this,Vector2d *q_ref,Vector2d *X_ref)

{
  ActualDstType actualDst;
  lmik *this_00;
  SrcEvaluatorType srcEvaluator;
  Vector2d q;
  Vector2d delta_q;
  Vector2d g;
  Vector2d e;
  Matrix2d H;
  Matrix2d J;
  Matrix2d W_N;
  Vector2d local_f8;
  Product<Eigen::Inverse<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>,_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0>
  local_e8;
  double local_d8;
  double dStack_d0;
  undefined1 local_c8 [32];
  Vector2d local_a8;
  Matrix2d local_98;
  Matrix2d local_78;
  Matrix2d local_58;
  
  local_f8.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0] =
       (q_ref->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data.array
       [0];
  local_f8.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[1] =
       (q_ref->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data.array
       [1];
  this_00 = this;
  do {
    local_d8 = local_f8.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.
               m_data.array[0];
    dStack_d0 = local_f8.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.
                m_data.array[1];
    cal_e(this_00,&local_a8,&local_f8,X_ref);
    cal_J(this_00,&local_78,&local_f8);
    cal_g(this,(Vector2d *)(local_c8 + 0x10),&local_78,&local_a8);
    cal_W_N(this,&local_58,&local_a8);
    cal_H(this,&local_98,&local_78,&local_58);
    this_00 = (lmik *)local_c8;
    local_e8.m_lhs.m_xpr = &local_98;
    local_e8.m_rhs = (Vector2d *)(local_c8 + 0x10);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,2,1,0,2,1>,Eigen::Product<Eigen::Inverse<Eigen::Matrix<double,2,2,0,2,2>>,Eigen::Matrix<double,2,1,0,2,1>,0>>
              ((Matrix<double,_2,_1,_0,_2,_1> *)this_00,&local_e8);
    local_f8.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0]
         = local_d8 + (double)local_c8._0_8_;
    local_f8.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[1]
         = dStack_d0 + (double)local_c8._8_8_;
    if (ABS((double)local_c8._0_8_) <= this->threshold) break;
  } while (this->threshold < ABS((double)local_c8._8_8_));
  (q_ref->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data.array[0] =
       local_f8.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array
       [0];
  (q_ref->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data.array[1] =
       local_f8.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array
       [1];
  return;
}

Assistant:

void lmik::solve(Vector2d& q_ref, const Vector2d& X_ref) {
    Matrix2d W_N, J, H;
    Vector2d q, q_new, delta_q, e, g; 
    q = q_ref;
    
    do {
        cal_e(e, q, X_ref);
        cal_J(J, q);
        cal_g(g, J, e);
        cal_W_N(W_N, e);
        cal_H(H, J, W_N);
        delta_q = H.inverse() * g;
        q += delta_q;
    } while(abs(delta_q(0)) > threshold && abs(delta_q(1)) > threshold);

    q_ref = q;
    return;
}